

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentPoint::CompareComponentAndDirection
              (ON_SubDComponentPoint *a,ON_SubDComponentPoint *b)

{
  ulong uVar1;
  ulong uVar2;
  ON__UINT_PTR y;
  ON__UINT_PTR x;
  ON_SubDComponentPoint *b_local;
  ON_SubDComponentPoint *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a == (ON_SubDComponentPoint *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (b == (ON_SubDComponentPoint *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    uVar1 = (a->m_component_ptr).m_ptr & 6;
    uVar2 = (b->m_component_ptr).m_ptr & 6;
    if (uVar1 < uVar2) {
      a_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      a_local._4_4_ = 1;
    }
    else {
      uVar1 = (a->m_component_ptr).m_ptr & 0xfffffffffffffff8;
      uVar2 = (b->m_component_ptr).m_ptr & 0xfffffffffffffff8;
      if (uVar1 < uVar2) {
        a_local._4_4_ = -1;
      }
      else if (uVar2 < uVar1) {
        a_local._4_4_ = 1;
      }
      else {
        uVar1 = (a->m_component_ptr).m_ptr & 1;
        uVar2 = (b->m_component_ptr).m_ptr & 1;
        if (uVar1 < uVar2) {
          a_local._4_4_ = -1;
        }
        else if (uVar2 < uVar1) {
          a_local._4_4_ = 1;
        }
        else {
          a_local._4_4_ = 0;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDComponentPoint::CompareComponentAndDirection(
  const ON_SubDComponentPoint* a,
  const ON_SubDComponentPoint* b
  )
{
  if ( a == b)
    return 0;  
  if ( nullptr == a)
    return 1; // nullptr > non-null pointer.
  if ( nullptr == b)
    return -1; // nullptr > non-null pointer.

  // 1st: compare component type
  // unset < vertex < edge < face
  ON__UINT_PTR x = (ON_SUBD_COMPONENT_TYPE_MASK & a->m_component_ptr.m_ptr);
  ON__UINT_PTR y = (ON_SUBD_COMPONENT_TYPE_MASK & b->m_component_ptr.m_ptr);
  if ( x < y )
    return -1;
  if ( x > y )
    return 1;

  // 2nd: compare component pointer
  x = (a->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  y = (b->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_POINTER_MASK);
  if (x < y)
    return -1;
  if (x > y)
    return 1;

  // 3rd: compare component direction flag
  x = (a->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
  y = (b->m_component_ptr.m_ptr & ON_SUBD_COMPONENT_DIRECTION_MASK);
  if (x < y)
    return -1;
  if (x > y)
    return 1;

  return 0;
}